

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_block_elim_pass.cpp
# Opt level: O3

Status __thiscall
spvtools::opt::LocalSingleBlockLoadStoreElimPass::ProcessImpl
          (LocalSingleBlockLoadStoreElimPass *this)

{
  IRContext *this_00;
  Module *pMVar1;
  bool bVar2;
  Instruction *ai;
  Instruction *pIVar3;
  Status SVar4;
  FeatureManager *pFVar5;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  pFVar5 = (this_00->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar5 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(this_00);
    pFVar5 = (this_00->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  bVar2 = EnumSet<spv::Capability>::contains(&pFVar5->capabilities_,Addresses);
  SVar4 = SuccessWithoutChange;
  if (!bVar2) {
    pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    for (pIVar3 = *(Instruction **)
                   ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> +
                   0x10);
        pIVar3 != (Instruction *)
                  ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> +
                  8U);
        pIVar3 = (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
      if (pIVar3->opcode_ == OpGroupDecorate) {
        return SuccessWithoutChange;
      }
    }
    bVar2 = AllExtensionsSupported(this);
    if (bVar2) {
      local_38._8_8_ = 0;
      local_20 = std::
                 _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/local_single_block_elim_pass.cpp:220:25)>
                 ::_M_invoke;
      local_28 = std::
                 _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/local_single_block_elim_pass.cpp:220:25)>
                 ::_M_manager;
      local_38._M_unused._M_object = this;
      bVar2 = IRContext::ProcessReachableCallTree
                        ((this->super_MemPass).super_Pass.context_,(ProcessFunction *)&local_38);
      if (local_28 != (code *)0x0) {
        (*local_28)(&local_38,&local_38,__destroy_functor);
      }
      SVar4 = bVar2 ^ SuccessWithoutChange;
    }
  }
  return SVar4;
}

Assistant:

Pass::Status LocalSingleBlockLoadStoreElimPass::ProcessImpl() {
  // Assumes relaxed logical addressing only (see instruction.h).
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Addresses))
    return Status::SuccessWithoutChange;

  // Do not process if module contains OpGroupDecorate. Additional
  // support required in KillNamesAndDecorates().
  // TODO(greg-lunarg): Add support for OpGroupDecorate
  for (auto& ai : get_module()->annotations())
    if (ai.opcode() == spv::Op::OpGroupDecorate)
      return Status::SuccessWithoutChange;
  // If any extensions in the module are not explicitly supported,
  // return unmodified.
  if (!AllExtensionsSupported()) return Status::SuccessWithoutChange;
  // Process all entry point functions
  ProcessFunction pfn = [this](Function* fp) {
    return LocalSingleBlockLoadStoreElim(fp);
  };

  bool modified = context()->ProcessReachableCallTree(pfn);
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}